

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

void __thiscall
CLParam<double>::CLParam(CLParam<double> *this,string *param_name,string *info,double default_val)

{
  string *__rhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param_name_split;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this->_vptr_CLParam = (_func_int **)&PTR__CLParam_00115d48;
  __rhs = &this->parameter_name;
  std::__cxx11::string::string((string *)__rhs,(string *)param_name);
  this->parameter_name_short = '\0';
  std::__cxx11::string::string((string *)&this->description,(string *)info);
  this->value = default_val;
  this->default_value = default_val;
  this->is_set = false;
  if ((this->description)._M_string_length == 0) {
    std::operator+(&local_48,"No description for ",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &param_name_split,&local_48,". I guess you\'re on your own.");
    std::__cxx11::string::operator=((string *)&this->description,(string *)&param_name_split);
    std::__cxx11::string::~string((string *)&param_name_split);
    std::__cxx11::string::~string((string *)&local_48);
  }
  CLOptionsHelper::split(&param_name_split,param_name,',');
  if ((long)param_name_split.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)param_name_split.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x40) {
    this->parameter_name_short =
         *((param_name_split.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_assign((string *)__rhs);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&param_name_split);
  return;
}

Assistant:

CLParam<T>(const std::string& param_name,
               const std::string& info,
               T default_val) :
        parameter_name(param_name), description(info),
        value(default_val), default_value(default_val),
        is_set(false)
    {
        if (description.empty()) description="No description for " + parameter_name + ". I guess you're on your own.";
        std::vector<std::string> param_name_split = CLOptionsHelper::split(param_name, ',') ;
        if (param_name_split.size() == 2) {
            parameter_name_short = param_name_split[0][0] ;
            parameter_name = param_name_split[1] ;
        }
    }